

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolMACEthernet.cpp
# Opt level: O1

ostream * operator<<(ostream *out,ProtocolMACEthernet *obj)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  size_t sVar3;
  undefined4 extraout_var_00;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"MAC Configuration\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(out,"   Ethernet Unicast MAC Address: ",0x21);
  iVar1 = (*(obj->super_InterfaceMAC)._vptr_InterfaceMAC[5])(obj);
  pcVar2 = macaddrtoa((uint8_t *)CONCAT44(extraout_var,iVar1));
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"   Ethernet Broadcast MAC Address: ",0x23)
  ;
  iVar1 = (*(obj->super_InterfaceMAC)._vptr_InterfaceMAC[6])(obj);
  pcVar2 = macaddrtoa((uint8_t *)CONCAT44(extraout_var_00,iVar1));
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ProtocolMACEthernet& obj)
{
    out << "MAC Configuration\n";
    out << "   Ethernet Unicast MAC Address: " << macaddrtoa(obj.GetUnicastAddress()) << "\n";
    out << "   Ethernet Broadcast MAC Address: " << macaddrtoa(obj.GetBroadcastAddress()) << "\n";
    return out;
}